

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_AttachLinsol
              (void *arkode_mem,ARKLinsolInitFn linit,ARKLinsolSetupFn lsetup,
              ARKLinsolSolveFn lsolve,ARKLinsolFreeFn lfree,SUNLinearSolver_Type lsolve_type,
              void *lmem)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_40;
  ARKodeMem local_38;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_AttachLinsol",&local_38,&local_40);
  if (iVar1 == 0) {
    if (local_40->lfree != (ARKLinsolFreeFn)0x0) {
      (*local_40->lfree)(arkode_mem);
    }
    local_40->linit = linit;
    local_40->lsetup = lsetup;
    local_40->lsolve = lsolve;
    local_40->lfree = lfree;
    local_40->lmem = lmem;
    iVar1 = 0;
    local_40->nsetups = 0;
    local_40->nstlp = 0;
  }
  return iVar1;
}

Assistant:

int mriStep_AttachLinsol(void* arkode_mem, ARKLinsolInitFn linit,
                         ARKLinsolSetupFn lsetup,
                         ARKLinsolSolveFn lsolve,
                         ARKLinsolFreeFn lfree,
                         SUNLinearSolver_Type lsolve_type,
                         void *lmem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_AttachLinsol",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* free any existing system solver */
  if (step_mem->lfree != NULL)  step_mem->lfree(arkode_mem);

  /* Attach the provided routines, data structure and solve type */
  step_mem->linit  = linit;
  step_mem->lsetup = lsetup;
  step_mem->lsolve = lsolve;
  step_mem->lfree  = lfree;
  step_mem->lmem   = lmem;

  /* Reset all linear solver counters */
  step_mem->nsetups = 0;
  step_mem->nstlp   = 0;

  return(ARK_SUCCESS);
}